

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::GetOwnPropertyNamesInfoAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<1UL> *argAction;
  TTDVar origVar;
  RecyclableObject *this;
  ScriptContext *pSVar4;
  JavascriptArray *instance;
  undefined4 *puVar5;
  JavascriptArray *res;
  RecyclableObject *__obj;
  Var var;
  JsRTSingleVarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)54>
                        (evt);
  origVar = GetVarItem_0<1ul>(argAction);
  __obj = (RecyclableObject *)InflateVarInReplay(executeContext,origVar);
  if ((__obj != (RecyclableObject *)0x0) &&
     (BVar3 = Js::JavascriptOperators::IsObject(__obj), BVar3 != 0)) {
    this = Js::VarTo<Js::RecyclableObject>(__obj);
    pSVar4 = Js::RecyclableObject::GetScriptContext(this);
    if (pSVar4 != scriptContext) {
      __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,this,false);
    }
    instance = Js::JavascriptOperators::GetOwnPropertyNames(__obj,scriptContext);
    if ((instance != (JavascriptArray *)0x0) &&
       (BVar3 = Js::CrossSite::NeedMarshalVar(instance,scriptContext), BVar3 != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                         ,0x280,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))",
                         "res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)54>
              (executeContext,evt,instance);
  }
  return;
}

Assistant:

void GetOwnPropertyNamesInfoAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetOwnPropertyNamesInfoActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            Js::JavascriptArray* res = Js::JavascriptOperators::GetOwnPropertyNames(var, ctx);
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::GetOwnPropertyNamesInfoActionTag>(executeContext, evt, res);
        }